

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::SubroutinesTessControl::Run(SubroutinesTessControl *this)

{
  CallLogWrapper *this_00;
  GLuint program;
  long error;
  undefined1 in_stack_ffffffffffffff28;
  char *local_d0 [4];
  char *local_b0 [4];
  char *local_90 [4];
  char *local_70 [4];
  char *local_50 [4];
  
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x16])(local_50,this);
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x18])(local_70,this);
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x19])(local_90,this);
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x1a])(local_b0,this);
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x17])(local_d0,this);
  program = PIQBase::CreateProgram
                      ((PIQBase *)this,local_50[0],local_70[0],local_90[0],local_b0[0],local_d0[0],
                       (bool)in_stack_ffffffffffffff28);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_50);
  this_00 = &(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
             super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"position");
  glu::CallLogWrapper::glBindFragDataLocation(this_00,program,0,"color");
  PIQBase::LinkProgram((PIQBase *)this,program);
  local_50[0] = (char *)0x0;
  (*(this->super_SubroutinesBase).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x1c])(this,(ulong)program,local_50);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  return (long)local_50[0];
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), TessControlShader().c_str(), TessEvalShader().c_str(),
									   GeometryShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);
		long error = NO_ERROR;

		VerifyTCS(program, error);

		glDeleteProgram(program);
		return error;
	}